

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O0

char * TUPU::opErrorString(int err)

{
  char *pcVar1;
  int in_EDI;
  char *local_8;
  
  if (0 < in_EDI) {
    pcVar1 = (char *)curl_easy_strerror(in_EDI);
    return pcVar1;
  }
  if (in_EDI < 0) {
    switch(in_EDI) {
    case -10:
      local_8 = "Other unclassified error";
      break;
    default:
      goto LAB_001ebc19;
    case -6:
      local_8 = "Failed to verify response signature";
      break;
    case -5:
      local_8 = "Failed to parse response data";
      break;
    case -4:
      local_8 = "Request failed";
      break;
    case -3:
      local_8 = "Failded to send request";
      break;
    case -2:
      local_8 = "Failed to sign request";
      break;
    case -1:
      local_8 = "Wrong parameter";
    }
  }
  else {
LAB_001ebc19:
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char * opErrorString(int err) {
    if (err > 0)
        return curl_easy_strerror((CURLcode)err);
    else if (err < 0) {
        switch (err) {
            case OPC_WRONGPARAM:
                return "Wrong parameter";
            case OPC_SIGNFAILED:
                return "Failed to sign request";
            case OPC_SENDFAILED:
                return "Failded to send request";
            case OPC_REQFAILED:
                return "Request failed";
            case OPC_PARSEFAILED:
                return "Failed to parse response data";
            case OPC_VERIFYFAILED:
                return "Failed to verify response signature";
            case OPC_OTHERS:
                return "Other unclassified error";
        }
    }
    return "";
}